

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void display_group_member
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t wid)

{
  uint8_t attr;
  uint uVar1;
  undefined8 *puVar2;
  uint *puVar3;
  byte *pbVar4;
  size_t sVar5;
  undefined7 in_register_00000011;
  char buf [12];
  
  puVar2 = (undefined8 *)menu->menu_data;
  attr = curs_attrs[1][(wchar_t)CONCAT71(in_register_00000011,cursor) == oid];
  (*(code *)*puVar2)(col,row,CONCAT71(in_register_00000011,cursor),oid);
  if ((*(char *)(puVar2 + 6) == '\x01') && (puVar2[3] != 0)) {
    puVar3 = (uint *)(*(code *)puVar2[2])(oid);
    uVar1 = *puVar3;
    pbVar4 = (byte *)(*(code *)puVar2[3])(oid);
    strnfmt(buf,0xc,"%d/%d",(ulong)*pbVar4,(ulong)uVar1);
    sVar5 = strlen(buf);
    c_put_str(attr,buf,row,L'@' - (int)sVar5);
  }
  return;
}

Assistant:

static void display_group_member(struct menu *menu, int oid,
						bool cursor, int row, int col, int wid)
{
	const member_funcs *o_funcs = menu->menu_data;
	uint8_t attr = curs_attrs[CURS_KNOWN][cursor == oid];

	(void)wid;

	/* Print the interesting part */
	o_funcs->display_member(col, row, cursor, oid);

#ifdef KNOWLEDGE_MENU_DEBUG
	c_put_str(attr, format("%d", oid), row, 60);
#endif

	/* Do visual mode */
	if (o_funcs->is_visual && o_funcs->xattr) {
		wchar_t c = *o_funcs->xchar(oid);
		uint8_t a = *o_funcs->xattr(oid);
		char buf[12];

		strnfmt(buf, sizeof(buf), "%d/%d", a, c);
		c_put_str(attr, buf, row, 64 - (int) strlen(buf));
	}
}